

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

void vkt::ssbo::anon_unknown_15::initRefDataStorage
               (ShaderInterface *interface,BufferLayout *layout,RefDataStorage *storage)

{
  int bufferSize;
  pointer puVar1;
  pointer pBVar2;
  pointer piVar3;
  long lVar4;
  uint uVar5;
  ulong __new_size;
  pointer pBVar6;
  pointer puVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  BlockDataPtr BVar11;
  vector<int,_std::allocator<int>_> bufferSizes;
  vector<int,_std::allocator<int>_> local_48;
  
  computeBufferSizes(&local_48,interface,layout);
  __new_size = 0;
  piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      uVar5 = (int)__new_size + *piVar3;
      __new_size = (ulong)uVar5;
      piVar3 = piVar3 + 1;
    } while (piVar3 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    __new_size = (ulong)(int)uVar5;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&storage->data,__new_size);
  puVar1 = (storage->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar7 = (pointer)0x0;
  if (puVar1 != (storage->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    puVar7 = puVar1;
  }
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::resize
            (&storage->pointers,
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6);
  pBVar6 = (layout->blocks).
           super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(layout->blocks).
                              super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6) >> 6)) {
    lVar8 = 0;
    lVar9 = 8;
    lVar4 = 0;
    iVar10 = 0;
    do {
      bufferSize = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4];
      BVar11 = getBlockDataPtr(layout,(BlockLayoutEntry *)
                                      ((long)&(pBVar6->name)._M_dataplus + lVar8),puVar7 + iVar10,
                               bufferSize);
      pBVar2 = (storage->pointers).
               super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(void **)((long)pBVar2 + lVar9 + -8) = BVar11.ptr;
      *(long *)((long)&pBVar2->ptr + lVar9) = BVar11._8_8_;
      iVar10 = iVar10 + bufferSize;
      lVar4 = lVar4 + 1;
      pBVar6 = (layout->blocks).
               super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x40;
      lVar9 = lVar9 + 0x10;
    } while (lVar4 < (int)((ulong)((long)(layout->blocks).
                                         super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6)
                          >> 6));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void initRefDataStorage (const ShaderInterface& interface, const BufferLayout& layout, RefDataStorage& storage)
{
	DE_ASSERT(storage.data.empty() && storage.pointers.empty());

	const vector<int>	bufferSizes = computeBufferSizes(interface, layout);
	int					totalSize	= 0;

	for (vector<int>::const_iterator sizeIter = bufferSizes.begin(); sizeIter != bufferSizes.end(); ++sizeIter)
		totalSize += *sizeIter;

	storage.data.resize(totalSize);

	// Pointers for each block.
	{
		deUint8*	basePtr		= storage.data.empty() ? DE_NULL : &storage.data[0];
		int			curOffset	= 0;

		DE_ASSERT(bufferSizes.size() == layout.blocks.size());
		DE_ASSERT(totalSize == 0 || basePtr);

		storage.pointers.resize(layout.blocks.size());

		for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
		{
			const BlockLayoutEntry&	blockLayout		= layout.blocks[blockNdx];
			const int				bufferSize		= bufferSizes[blockNdx];

			storage.pointers[blockNdx] = getBlockDataPtr(layout, blockLayout, basePtr + curOffset, bufferSize);

			curOffset += bufferSize;
		}
	}
}